

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundColumnRefExpression::Deserialize
          (BoundColumnRefExpression *this,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  _func_int **pp_Var3;
  BoundColumnRefExpression *this_00;
  ColumnBinding binding;
  LogicalType return_type;
  LogicalType local_60;
  LogicalType local_48;
  idx_t depth;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"return_type");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  LogicalType::Deserialize(&local_60,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xc9,"binding");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  binding = ColumnBinding::Deserialize(deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"depth");
  pp_Var3 = deserializer->_vptr_Deserializer;
  if ((char)uVar1 == '\0') {
    depth = 0;
  }
  else {
    iVar2 = (*pp_Var3[0x15])(deserializer);
    depth = CONCAT44(extraout_var,iVar2);
    pp_Var3 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var3[5])(deserializer,(ulong)(uVar1 & 0xff));
  this_00 = (BoundColumnRefExpression *)operator_new(0x70);
  LogicalType::LogicalType(&local_48,&local_60);
  BoundColumnRefExpression(this_00,&local_48,binding,depth);
  LogicalType::~LogicalType(&local_48);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression = (_func_int **)this_00;
  LogicalType::~LogicalType(&local_60);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundColumnRefExpression::Deserialize(Deserializer &deserializer) {
	auto return_type = deserializer.ReadProperty<LogicalType>(200, "return_type");
	auto binding = deserializer.ReadProperty<ColumnBinding>(201, "binding");
	auto depth = deserializer.ReadPropertyWithDefault<idx_t>(202, "depth");
	auto result = duckdb::unique_ptr<BoundColumnRefExpression>(new BoundColumnRefExpression(std::move(return_type), binding, depth));
	return std::move(result);
}